

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_chr.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ulong uVar1;
  string query_path_00;
  string reference_path_00;
  string chrom_size_path_00;
  string id_00;
  int *NI_00;
  int *n_chr_00;
  _Alloc_hider __nptr;
  int i_2;
  int iVar2;
  uint uVar3;
  int m;
  int iVar4;
  int *piVar5;
  long lVar6;
  long *plVar7;
  void *pvVar8;
  double *pdVar9;
  native_handle_type *pnVar10;
  ostream *poVar11;
  double *pdVar12;
  double *pdVar13;
  undefined8 uVar14;
  double *__result;
  long lVar15;
  char *pcVar16;
  native_handle_type *pnVar17;
  ulong uVar18;
  int i;
  uint uVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  undefined1 auStack_228 [12];
  int scale;
  double **local_218;
  void *local_210;
  int *m_chr;
  long *local_200;
  string id;
  double *eta_chr;
  int *NI;
  int *n_chr;
  string __str;
  string resultpath;
  thread local_180;
  native_handle_type local_178;
  native_handle_type local_170;
  native_handle_type nStack_168;
  long *local_160;
  double *local_158;
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  string chrom_size_path;
  string reference_path;
  string thread_mode;
  string query_path;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_7425,0x54)
  ;
  if (argc < 7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Usage:\n\tistat <QUERY_INTERVALS_FILE> <REFERENCE_INTERVALS_FILE> <CHROMOSOME_SIZES_FILE>\n\t<SCALING_FACTOR> <OUTPUT_FILE> <THREADING_MODE>\n\nDescription:\n\tComputes the p-value of overlap between query and reference intervals.\n"
               ,0xdf);
    return 1;
  }
  std::__cxx11::string::string((string *)&query_path,argv[1],(allocator *)&reference_path);
  std::__cxx11::string::string((string *)&reference_path,argv[2],(allocator *)&chrom_size_path);
  std::__cxx11::string::string((string *)&chrom_size_path,argv[3],(allocator *)&resultpath);
  std::__cxx11::string::string((string *)&resultpath,argv[4],(allocator *)&id);
  __nptr = resultpath._M_dataplus;
  piVar5 = __errno_location();
  iVar2 = *piVar5;
  *piVar5 = 0;
  lVar6 = strtol(__nptr._M_p,(char **)&thread_mode,10);
  if (thread_mode._M_dataplus._M_p == __nptr._M_p) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar6 == lVar6) && (*piVar5 != 0x22)) {
    if (*piVar5 == 0) {
      *piVar5 = iVar2;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)resultpath._M_dataplus._M_p != &resultpath.field_2) {
      operator_delete(resultpath._M_dataplus._M_p);
    }
    scale = (int)lVar6;
    std::__cxx11::string::string((string *)&resultpath,argv[5],(allocator *)&thread_mode);
    std::__cxx11::string::string((string *)&thread_mode,argv[6],(allocator *)&id);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"scale is ",9);
    plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,scale);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    local_210 = operator_new__(200);
    lVar6 = 0;
    do {
      pvVar8 = operator_new__(800000);
      *(void **)((long)local_210 + lVar6 * 8) = pvVar8;
      memset(pvVar8,0,800000);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x19);
    local_218 = (double **)operator_new__(200);
    lVar6 = 0;
    do {
      pdVar9 = (double *)operator_new__(800000);
      local_218[lVar6] = pdVar9;
      lVar15 = 0;
      do {
        pdVar9[lVar15] = -1.0;
        (pdVar9 + lVar15)[1] = -1.0;
        lVar15 = lVar15 + 2;
      } while (lVar15 != 100000);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x19);
    n_chr = (int *)operator_new__(100);
    m_chr = (int *)operator_new__(100);
    NI = (int *)operator_new__(100);
    eta_chr = (double *)operator_new__(200);
    local_160 = (long *)operator_new__(200);
    *local_160 = 0x18;
    plVar7 = local_160 + 1;
    memset(plVar7,0,0xc0);
    iVar2 = std::__cxx11::string::compare((char *)&thread_mode);
    if (iVar2 == 0) {
      uVar22 = 0;
      local_200 = plVar7;
      do {
        id._M_dataplus._M_p = (pointer)&id.field_2;
        id._M_string_length = 0;
        id.field_2._M_local_buf[0] = '\0';
        uVar1 = uVar22 + 1;
        pcVar16 = "chrY";
        if ((int)uVar22 == 0x17) {
LAB_00105ed5:
          std::__cxx11::string::_M_replace((ulong)&id,0,(char *)0x0,(ulong)pcVar16);
        }
        else {
          if ((int)uVar22 == 0x16) {
            pcVar16 = "chrX";
            goto LAB_00105ed5;
          }
          uVar20 = 1;
          if (8 < uVar22) {
            uVar19 = 4;
            uVar18 = uVar1;
            do {
              uVar20 = uVar19;
              uVar3 = (uint)uVar18;
              if (uVar3 < 100) {
                uVar20 = uVar20 - 2;
                goto LAB_00105f42;
              }
              if (uVar3 < 1000) {
                uVar20 = uVar20 - 1;
                goto LAB_00105f42;
              }
              if (uVar3 < 10000) goto LAB_00105f42;
              uVar18 = (uVar18 & 0xffffffff) / 10000;
              uVar19 = uVar20 + 4;
            } while (99999 < uVar3);
            uVar20 = uVar20 + 1;
          }
LAB_00105f42:
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          std::__cxx11::string::_M_construct((ulong)&__str,(char)uVar20);
          std::__detail::__to_chars_10_impl<unsigned_int>(__str._M_dataplus._M_p,uVar20,(uint)uVar1)
          ;
          pnVar10 = (native_handle_type *)
                    std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x10a1bf);
          pnVar17 = pnVar10 + 2;
          if ((native_handle_type *)*pnVar10 == pnVar17) {
            local_170 = *pnVar17;
            nStack_168 = pnVar10[3];
            local_180._M_id._M_thread = (id)(id)&local_170;
          }
          else {
            local_170 = *pnVar17;
            local_180._M_id._M_thread = (id)(id)*pnVar10;
          }
          local_178 = pnVar10[1];
          *pnVar10 = (native_handle_type)pnVar17;
          pnVar10[1] = 0;
          *(undefined1 *)(pnVar10 + 2) = 0;
          std::__cxx11::string::operator=((string *)&id,(string *)&local_180);
          if (local_180._M_id._M_thread != (id)&local_170) {
            operator_delete((void *)local_180._M_id._M_thread);
          }
          plVar7 = local_200;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p);
            plVar7 = local_200;
          }
        }
        __str._M_dataplus._M_p._0_4_ = (uint)uVar1;
        std::thread::
        thread<void(&)(int*,int*,double*,int*,double*,double*,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,int,std::__cxx11::string,int),int*&,int*&,double*&,int*&,double*&,double*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int,std::__cxx11::string&,int&,void>
                  (&local_180,call_from_thread,&n_chr,&m_chr,local_218 + uVar1,&NI,&eta_chr,
                   (double **)((long)local_210 + uVar1 * 8),&query_path,&reference_path,
                   &chrom_size_path,(int *)&__str,&id,&scale);
        if (plVar7[uVar22] != 0) {
          std::terminate();
        }
        ((id *)(plVar7 + uVar22))->_M_thread = (native_handle_type)local_180._M_id._M_thread;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)id._M_dataplus._M_p != &id.field_2) {
          operator_delete(id._M_dataplus._M_p);
        }
        uVar22 = uVar1;
      } while (uVar1 != 0x18);
      lVar6 = 8;
      do {
        std::thread::join();
        lVar6 = lVar6 + 8;
      } while (lVar6 != 200);
    }
    else {
      plVar7 = (long *)0x1;
      do {
        id._M_dataplus._M_p = (pointer)&id.field_2;
        id._M_string_length = 0;
        id.field_2._M_local_buf[0] = '\0';
        pcVar16 = "chrY";
        uVar20 = (uint)plVar7;
        if (uVar20 == 0x18) {
LAB_00105bd4:
          std::__cxx11::string::_M_replace((ulong)&id,0,(char *)0x0,(ulong)pcVar16);
        }
        else {
          if (uVar20 == 0x17) {
            pcVar16 = "chrX";
            goto LAB_00105bd4;
          }
          uVar19 = 2 - (plVar7 < (long *)0xa);
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          std::__cxx11::string::_M_construct((ulong)&__str,(char)uVar19);
          std::__detail::__to_chars_10_impl<unsigned_int>(__str._M_dataplus._M_p,uVar19,uVar20);
          pnVar10 = (native_handle_type *)
                    std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x10a1bf);
          pnVar17 = pnVar10 + 2;
          if ((native_handle_type *)*pnVar10 == pnVar17) {
            local_170 = *pnVar17;
            nStack_168 = pnVar10[3];
            local_180._M_id._M_thread = (id)(id)&local_170;
          }
          else {
            local_170 = *pnVar17;
            local_180._M_id._M_thread = (id)(id)*pnVar10;
          }
          local_178 = pnVar10[1];
          *pnVar10 = (native_handle_type)pnVar17;
          pnVar10[1] = 0;
          *(undefined1 *)(pnVar10 + 2) = 0;
          std::__cxx11::string::operator=((string *)&id,(string *)&local_180);
          if (local_180._M_id._M_thread != (id)&local_170) {
            operator_delete((void *)local_180._M_id._M_thread);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p);
          }
        }
        n_chr_00 = n_chr;
        NI_00 = NI;
        pdVar13 = eta_chr;
        piVar5 = m_chr;
        pdVar9 = local_218[(long)plVar7];
        pdVar12 = *(double **)((long)local_210 + (long)plVar7 * 8);
        local_110[0] = local_100;
        local_200 = plVar7;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_110,query_path._M_dataplus._M_p,
                   query_path._M_dataplus._M_p + query_path._M_string_length);
        local_130[0] = local_120;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_130,reference_path._M_dataplus._M_p,
                   reference_path._M_dataplus._M_p + reference_path._M_string_length);
        local_150[0] = local_140;
        local_158 = pdVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_150,chrom_size_path._M_dataplus._M_p,
                   chrom_size_path._M_dataplus._M_p + chrom_size_path._M_string_length);
        local_f0[0] = local_e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_f0,id._M_dataplus._M_p,id._M_dataplus._M_p + id._M_string_length)
        ;
        plVar7 = local_200;
        query_path_00._M_string_length = (size_type)local_130;
        query_path_00._M_dataplus._M_p = (pointer)local_110;
        query_path_00.field_2._M_allocated_capacity = (size_type)local_150;
        query_path_00.field_2._8_8_ = local_200;
        reference_path_00._M_string_length._0_4_ = scale;
        reference_path_00._M_dataplus._M_p = (pointer)local_f0;
        reference_path_00._M_string_length._4_4_ = 0;
        reference_path_00.field_2._0_12_ = auStack_228;
        reference_path_00.field_2._12_4_ = scale;
        chrom_size_path_00._M_string_length = (size_type)local_210;
        chrom_size_path_00._M_dataplus._M_p = (pointer)local_218;
        chrom_size_path_00.field_2._M_allocated_capacity = (size_type)m_chr;
        chrom_size_path_00.field_2._8_8_ = local_200;
        id_00._M_string_length._0_1_ = id.field_2._M_local_buf[0];
        id_00._M_dataplus._M_p = (pointer)id._M_string_length;
        id_00._9_15_ = id.field_2._1_15_;
        id_00.field_2._8_8_ = eta_chr;
        chrom(n_chr_00,piVar5,local_158,NI_00,pdVar13,pdVar12,query_path_00,reference_path_00,
              chrom_size_path_00,(int)id._M_dataplus._M_p,id_00,(int)NI);
        if (local_f0[0] != local_e0) {
          operator_delete(local_f0[0]);
        }
        if (local_150[0] != local_140) {
          operator_delete(local_150[0]);
        }
        if (local_130[0] != local_120) {
          operator_delete(local_130[0]);
        }
        if (local_110[0] != local_100) {
          operator_delete(local_110[0]);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)id._M_dataplus._M_p != &id.field_2) {
          operator_delete(id._M_dataplus._M_p);
        }
        plVar7 = (long *)((long)plVar7 + 1);
      } while (plVar7 != (long *)0x19);
    }
    iVar2 = sum(n_chr,0x18);
    m = sum(m_chr,0x18);
    iVar4 = sum(NI,0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Number of query intervals (n) is ",0x21);
    plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Number of reference intervals (m) is ",0x25);
    plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,m);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Overlap is ",0xb);
    plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    pdVar9 = eta_chr + 1;
    lVar6 = 0x10;
    do {
      if (*(double *)((long)eta_chr + lVar6) <= *pdVar9 &&
          *pdVar9 != *(double *)((long)eta_chr + lVar6)) {
        pdVar9 = (double *)((long)eta_chr + lVar6);
      }
      lVar6 = lVar6 + 8;
    } while (lVar6 != 200);
    local_200 = (long *)*pdVar9;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"eta is ",7);
    poVar11 = std::ostream::_M_insert<double>((double)local_200);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    uVar22 = 0xffffffffffffffff;
    if (-2 < m) {
      uVar22 = (long)m * 8 + 8;
    }
    pdVar9 = (double *)operator_new__(uVar22);
    combine_chr(pdVar9,m,0x18,m_chr,local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DP p-value is ",0xe);
    poVar11 = std::ostream::_M_insert<double>(pdVar9[iVar4]);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    pdVar12 = (double *)operator_new__(uVar22);
    iVar2 = 0;
    lVar6 = 1;
    do {
      uVar20 = m_chr[lVar6];
      if (0 < (int)uVar20) {
        lVar15 = *(long *)((long)local_210 + lVar6 * 8);
        lVar21 = 1;
        do {
          pdVar12[iVar2 + lVar21] = *(double *)(lVar15 + lVar21 * 8);
          lVar21 = lVar21 + 1;
        } while ((ulong)uVar20 + 1 != lVar21);
      }
      iVar2 = uVar20 + iVar2;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x19);
    pdVar13 = (double *)operator_new__(uVar22);
    poisbinom(pdVar13,pdVar12,m);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PB p-value is ",0xe);
    poVar11 = std::ostream::_M_insert<double>(pdVar13[iVar4]);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,resultpath._M_dataplus._M_p,
               resultpath._M_dataplus._M_p + resultpath._M_string_length);
    write2file(&local_50,pdVar9,pdVar13,m);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    lVar6 = 0;
    do {
      pvVar8 = *(void **)((long)local_210 + lVar6 * 8);
      if (pvVar8 != (void *)0x0) {
        operator_delete__(pvVar8);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x19);
    operator_delete__(local_210);
    lVar6 = 0;
    do {
      if (local_218[lVar6] != (double *)0x0) {
        operator_delete__(local_218[lVar6]);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x19);
    operator_delete__(local_218);
    if (n_chr != (int *)0x0) {
      operator_delete__(n_chr);
    }
    if (m_chr != (int *)0x0) {
      operator_delete__(m_chr);
    }
    if (NI != (int *)0x0) {
      operator_delete__(NI);
    }
    if (eta_chr != (double *)0x0) {
      operator_delete__(eta_chr);
    }
    if (*local_160 != 0) {
      lVar6 = *local_160 << 3;
      do {
        if (*(long *)((long)local_160 + lVar6) != 0) {
          std::terminate();
        }
        lVar6 = lVar6 + -8;
      } while (lVar6 != 0);
    }
    operator_delete__(local_160);
    operator_delete__(pdVar9);
    operator_delete__(pdVar12);
    operator_delete__(pdVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)thread_mode._M_dataplus._M_p != &thread_mode.field_2) {
      operator_delete(thread_mode._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)resultpath._M_dataplus._M_p != &resultpath.field_2) {
      operator_delete(resultpath._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)chrom_size_path._M_dataplus._M_p != &chrom_size_path.field_2) {
      operator_delete(chrom_size_path._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)reference_path._M_dataplus._M_p != &reference_path.field_2) {
      operator_delete(reference_path._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)query_path._M_dataplus._M_p != &query_path.field_2) {
      operator_delete(query_path._M_dataplus._M_p);
    }
    return 0;
  }
  uVar14 = std::__throw_out_of_range("stoi");
  if ((int *)local_50._M_dataplus._M_p != piVar5) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)thread_mode._M_dataplus._M_p != &thread_mode.field_2) {
    operator_delete(thread_mode._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)resultpath._M_dataplus._M_p != &resultpath.field_2) {
    operator_delete(resultpath._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)chrom_size_path._M_dataplus._M_p != &chrom_size_path.field_2) {
    operator_delete(chrom_size_path._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)reference_path._M_dataplus._M_p != &reference_path.field_2) {
    operator_delete(reference_path._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)query_path._M_dataplus._M_p != &query_path.field_2) {
    operator_delete(query_path._M_dataplus._M_p);
  }
  _Unwind_Resume(uVar14);
}

Assistant:

int main(int argc, char** argv)
{
    cout << HEADER;

    if (argc < 7)
    {
        cout << USAGE;
        return 1;
    }
    string query_path = argv[1];
    string reference_path = argv[2];
    string chrom_size_path = argv[3];
    int scale = stoi(argv[4]);
    string resultpath = argv[5];
    string thread_mode = argv[6];
    int num_chr = 24;
    cout << "scale is " << scale << endl;
    int max_m_chr = 100000;
    double** Pj;
    Pj = new double* [num_chr+1];
    for(int i=0; i<=num_chr; i++)
    {
        Pj[i] = new double [max_m_chr];
        for(int k=0; k<max_m_chr; k++)
        {
            Pj[i][k] = 0;
        }
    }

    double** NM; //log scale
    NM = new double* [num_chr+1];
    for(int i=0; i<=num_chr; i++)
    {
        NM[i] = new double [max_m_chr];
        for(int k=0; k<max_m_chr; k++)
            {
                NM[i][k] = -1;
            }
    }

    int* n_chr = new int [num_chr+1];
    int* m_chr = new int [num_chr+1];
    int* NI = new int [num_chr+1];
    double* eta_chr = new double [num_chr+1];

    thread *th = new thread [num_chr];

    if (thread_mode=="p")
    {//Mltithreading
        for(int i=0; i<num_chr; i++)
        {
            string id;
            if (i+1==23)
                id = "chrX";
            else if (i+1==24)
                id = "chrY";
            else
                id = "chr" + to_string(i+1);
            th[i] = thread(call_from_thread, n_chr, m_chr, NM[i+1], NI, eta_chr, Pj[i+1],
                           query_path, reference_path, chrom_size_path, i+1, id, scale);
        }
        for(int i=0; i<num_chr; i++)
        {
            th[i].join();
        }
    }
    else
    {// Single thread
        for(int i=1; i<=num_chr; i++)
        {
            string id;
            if (i==23)
                id = "chrX";
            else if (i==24)
                id = "chrY";
            else
                id = "chr" + to_string(i);
            chrom(n_chr, m_chr, NM[i], NI, eta_chr, Pj[i], query_path, reference_path, chrom_size_path,
                          i, id, scale);
        }
    }
    // int job_id[8] = {0, 1, 2, 3, 4, 5, 6, num_chr-1};
    // for (int j=0; j<num_chr/8; j++)
    // {
    //     for(auto i: job_id)
    //     {
    //         string id;
    //         if (i+1==23)
    //             id = "chrX";
    //         else if (i+1==24)
    //             id = "chrY";
    //         else
    //             id = "chr" + to_string(i+1);
    //         th[i] = thread(call_from_thread, n_chr, m_chr, NM[i+1], NI, Pj[i+1],
    //                        query_path, reference_path, chrom_size_path, i+1, id, scale);
    //     }
    //     for(auto i: job_id)
    //     {
    //         th[i].join();
    //     }
    //     job_id[0] += 7;
    //     job_id[1] += 7;
    //     job_id[2] += 7;
    //     job_id[3] += 7;
    //     job_id[4] += 7;
    //     job_id[5] += 7;
    //     job_id[6] += 7;
    //     job_id[7]--;
    // }

    int n = sum(n_chr, num_chr);
    int m = sum(m_chr, num_chr);
    int N_intersect = sum(NI, num_chr);
    cout << "Number of query intervals (n) is " << n << endl;
    cout << "Number of reference intervals (m) is " << m << endl;
    cout << "Overlap is " << N_intersect << endl;

    // int mid = num_chr/2;
    // nth_element(eta_chr+1, eta_chr+1+mid, eta_chr+num_chr+1);
    // double eta = eta_chr[1+mid];
    double eta = *min_element(eta_chr+1, eta_chr+num_chr+1);
    cout << "eta is " << eta << endl;

    double* p_value_dp = new double [m+1];
    combine_chr(p_value_dp, m, num_chr, m_chr, NM);
    cout << "DP p-value is " << p_value_dp[N_intersect] << endl;

    double* p = new double [m+1];
    int idx = 0;
    for(int i=1; i<=num_chr; i++)
    {
      for(int k=1; k<=m_chr[i]; k++)
      {
        p[idx+k] = Pj[i][k];
      }
      idx += m_chr[i];
    }
    double* p_value_poisbinom = new double [m+1];
    poisbinom(p_value_poisbinom, p, m);
    cout << "PB p-value is " << p_value_poisbinom[N_intersect] << endl;

    // write2file(resultpath, p_value_dp, p_value_poisbinom, m);
    write2file(resultpath, p_value_dp, p_value_poisbinom, m);

    for(int i=0; i<=num_chr; i++)
    {
        delete [] Pj[i];
    }
    delete [] Pj;
    for(int i=0; i<=num_chr; i++)
    {
        delete [] NM[i];
    }
    delete [] NM;
    delete [] n_chr;
    delete [] m_chr;
    delete [] NI;
    delete [] eta_chr;
    delete [] th;
    delete [] p_value_dp;
    delete [] p;
    delete [] p_value_poisbinom;
    return 0;
}